

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

void ParseFunctionDef(FScanner *sc,PClassActor *cls,FName *funcname,TArray<PType_*,_PType_*> *rets,
                     DWORD funcflags)

{
  char *pcVar1;
  AFuncDesc *pAVar2;
  PFunction *this;
  PPrototype *proto;
  PSymbol *pPVar3;
  char *pcVar4;
  PClassActor *len;
  FName local_74;
  PFunction *local_70;
  PFunction *sym;
  undefined1 local_58 [8];
  TArray<unsigned_int,_unsigned_int> argflags;
  TArray<PType_*,_PType_*> args;
  AFuncDesc *afd;
  DWORD funcflags_local;
  TArray<PType_*,_PType_*> *rets_local;
  FName *funcname_local;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  if (cls == (PClassActor *)0x0) {
    __assert_fail("cls != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                  ,0x1c5,
                  "void ParseFunctionDef(FScanner &, PClassActor *, FName, TArray<PType *> &, DWORD)"
                 );
  }
  TArray<PType_*,_PType_*>::TArray((TArray<PType_*,_PType_*> *)&argflags.Most);
  TArray<unsigned_int,_unsigned_int>::TArray((TArray<unsigned_int,_unsigned_int> *)local_58);
  pcVar1 = FName::operator_cast_to_char_(funcname);
  pAVar2 = FindFunction(pcVar1);
  if (pAVar2 == (AFuncDesc *)0x0) {
    pcVar1 = FName::GetChars(funcname);
    FScanner::ScriptMessage
              (sc,"The function \'%s\' has not been exported from the executable.",pcVar1);
    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  }
  FScanner::MustGetToken(sc,0x28);
  SetImplicitArgs((TArray<PType_*,_PType_*> *)&argflags.Most,
                  (TArray<unsigned_int,_unsigned_int> *)local_58,cls,funcflags);
  len = cls;
  ParseArgListDef(sc,cls,(TArray<PType_*,_PType_*> *)&argflags.Most,
                  (TArray<unsigned_int,_unsigned_int> *)local_58);
  if (pAVar2 != (AFuncDesc *)0x0) {
    this = (PFunction *)DObject::operator_new((DObject *)0x40,(size_t)len);
    FName::FName(&local_74,funcname);
    PFunction::PFunction(this,&local_74);
    local_70 = this;
    proto = NewPrototype(rets,(TArray<PType_*,_PType_*> *)&argflags.Most);
    PFunction::AddVariant
              (this,proto,(TArray<unsigned_int,_unsigned_int> *)local_58,
               &(*pAVar2->VMPointer)->super_VMFunction);
    local_70->Flags = funcflags;
    pPVar3 = PSymbolTable::AddSymbol
                       (&(cls->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                         super_PType.Symbols,&local_70->super_PSymbol);
    if (pPVar3 == (PSymbol *)0x0) {
      if (local_70 != (PFunction *)0x0) {
        (*(local_70->super_PSymbol).super_DObject._vptr_DObject[2])();
      }
      pcVar1 = FName::GetChars(funcname);
      pcVar4 = FName::GetChars(&(cls->super_PClass).super_PStruct.super_PNamedType.TypeName);
      FScanner::ScriptMessage(sc,"\'%s\' is already defined in class \'%s\'.",pcVar1,pcVar4);
      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
    }
  }
  TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)local_58);
  TArray<PType_*,_PType_*>::~TArray((TArray<PType_*,_PType_*> *)&argflags.Most);
  return;
}

Assistant:

void ParseFunctionDef(FScanner &sc, PClassActor *cls, FName funcname,
	TArray<PType *> &rets, DWORD funcflags)
{
	assert(cls != NULL);

	const AFuncDesc *afd;
	TArray<PType *> args;
	TArray<DWORD> argflags;

	afd = FindFunction(funcname);
	if (afd == NULL)
	{
		sc.ScriptMessage ("The function '%s' has not been exported from the executable.", funcname.GetChars());
		FScriptPosition::ErrorCounter++;
	}
	sc.MustGetToken('(');

	SetImplicitArgs(&args, &argflags, cls, funcflags);
	ParseArgListDef(sc, cls, args, argflags);

	if (afd != NULL)
	{
		PFunction *sym = new PFunction(funcname);
		sym->AddVariant(NewPrototype(rets, args), argflags, *(afd->VMPointer));
		sym->Flags = funcflags;
		if (cls->Symbols.AddSymbol(sym) == NULL)
		{
			delete sym;
			sc.ScriptMessage ("'%s' is already defined in class '%s'.",
				funcname.GetChars(), cls->TypeName.GetChars());
			FScriptPosition::ErrorCounter++;
		}
	}
}